

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O2

void __thiscall HPrimal::primalUpdate(HPrimal *this)

{
  int *hint;
  HVector *this_00;
  long lVar1;
  double alpha;
  double dVar2;
  double dVar3;
  int iVar4;
  int columnOut;
  uint uVar5;
  uint uVar6;
  HModel *this_01;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  pointer pdVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  this_01 = this->model;
  pdVar7 = (this->column).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this_01->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this_01->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (this_01->baseLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar11 = (this_01->baseUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar15 = this->columnIn;
  iVar4 = piVar8[iVar15];
  iVar17 = this->rowOut;
  alpha = pdVar7[iVar17];
  pdVar19 = pdVar11;
  if (0.0 < (double)iVar4 * alpha) {
    pdVar19 = pdVar10;
  }
  pdVar12 = (this_01->baseValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  columnOut = (this_01->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar17];
  dVar21 = (this_01->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[iVar15];
  dVar2 = (this_01->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar15];
  pdVar13 = (this_01->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar3 = this_01->dblOption[1];
  dVar22 = (pdVar12[iVar17] - pdVar19[iVar17]) / alpha;
  dVar23 = pdVar13[iVar15] + dVar22;
  if (iVar4 == -1) {
    if (dVar21 - dVar3 <= dVar23) goto LAB_001360b2;
    pdVar13[iVar15] = dVar21;
    dVar22 = dVar21 - dVar2;
    iVar17 = 1;
  }
  else {
    if ((iVar4 != 1) || (dVar23 <= dVar3 + dVar2)) {
LAB_001360b2:
      bVar14 = false;
      goto LAB_001360b4;
    }
    pdVar13[iVar15] = dVar2;
    dVar22 = dVar2 - dVar21;
    iVar17 = -1;
  }
  piVar8[iVar15] = iVar17;
  bVar14 = true;
LAB_001360b4:
  uVar5 = (this->column).count;
  piVar8 = (this->column).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar18 = 0;
  uVar16 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar16 = uVar18;
  }
  for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
    iVar15 = piVar8[uVar18];
    pdVar12[iVar15] = pdVar7[iVar15] * -dVar22 + pdVar12[iVar15];
  }
  if (!bVar14) {
    HModel::updatePivots
              (this_01,this->columnIn,this->rowOut,(uint)((double)iVar4 * alpha <= 0.0) * 2 + -1);
    pdVar12[this->rowOut] = dVar23;
    hint = &this->invertHint;
    uVar18 = 0;
    uVar16 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar16 = uVar18;
    }
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      if ((pdVar12[uVar18] < pdVar10[uVar18] - dVar3) || (pdVar11[uVar18] + dVar3 < pdVar12[uVar18])
         ) {
        *hint = 7;
      }
    }
    this_00 = &this->row_ep;
    HVector::clear(this_00);
    HVector::clear(&this->row_ap);
    (this->row_ep).count = 1;
    iVar15 = this->rowOut;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar15;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = 1.0;
    (this->row_ep).packFlag = true;
    HFactor::btran(&this->model->factor,this_00,this->row_epDensity);
    HMatrix::price_by_row(&this->model->matrix,&this->row_ap,this_00);
    uVar5 = (this->row_ep).count;
    uVar6 = (this->row_ap).count;
    this->row_epDensity =
         this->row_epDensity * 0.95 + ((double)(int)uVar5 * 0.05) / (double)this->numRow;
    iVar15 = this->columnIn;
    piVar8 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar21 = -pdVar9[iVar15] / alpha;
    uVar18 = 0;
    uVar16 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar16 = uVar18;
    }
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      iVar4 = piVar8[uVar18];
      pdVar9[iVar4] = pdVar7[iVar4] * dVar21 + pdVar9[iVar4];
    }
    piVar8 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = this->numCol;
    uVar18 = 0;
    uVar16 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar16 = uVar18;
    }
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      lVar20 = (long)piVar8[uVar18];
      lVar1 = iVar4 + lVar20;
      pdVar9[lVar1] = pdVar7[lVar20] * dVar21 + pdVar9[lVar1];
    }
    pdVar9[iVar15] = 0.0;
    pdVar9[columnOut] = dVar21;
    HModel::updateFactor(this->model,&this->column,this_00,&this->rowOut,hint);
    HModel::updateMatrix(this->model,this->columnIn,columnOut);
    iVar15 = this->countUpdate + 1;
    this->countUpdate = iVar15;
    if (this->limitUpdate <= iVar15) {
      *hint = 1;
    }
    HModel::recordPivots(this->model,this->columnIn,columnOut,alpha);
    return;
  }
  return;
}

Assistant:

void HPrimal::primalUpdate() {
    int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double *baseLower = model->getBaseLower();
    const double *baseUpper = model->getBaseUpper();
    double *workValue = model->getWorkValue();
    double *baseValue = model->getBaseValue();
    const double primalTolerance = model->dblOption[DBLOPT_PRIMAL_TOL];

    // Compute thetaPrimal
    int moveIn = jMove[columnIn];
    int columnOut = model->getBaseIndex()[rowOut];
    double alpha = column.array[rowOut];
    double thetaPrimal = 0;
    if (alpha * moveIn > 0) {
        // Lower bound
        thetaPrimal = (baseValue[rowOut] - baseLower[rowOut]) / alpha;
    } else {
        // Upper bound
        thetaPrimal = (baseValue[rowOut] - baseUpper[rowOut]) / alpha;
    }

    // 1. Make sure it is inside bounds or just flip bound
    double lowerIn = workLower[columnIn];
    double upperIn = workUpper[columnIn];
    double valueIn = workValue[columnIn] + thetaPrimal;
    bool flipped = false;
    if (jMove[columnIn] == 1) {
        if (valueIn > upperIn + primalTolerance) {
            // Flip to upper
            workValue[columnIn] = upperIn;
            thetaPrimal = upperIn - lowerIn;
            flipped = true;
            jMove[columnIn] = -1;
        }
    } else if (jMove[columnIn] == -1) {
        if (valueIn < lowerIn - primalTolerance) {
            // Flip to lower
            workValue[columnIn] = lowerIn;
            thetaPrimal = lowerIn - upperIn;
            flipped = true;
            jMove[columnIn] = 1;
        }
    }

    for (int i = 0; i < column.count; i++) {
        int index = column.index[i];
        baseValue[index] -= thetaPrimal * column.array[index];
    }

    // If flipped, then no need touch the pivots
    if (flipped) {
        return;
    }

    // Pivot in
    int sourceOut = alpha * moveIn > 0 ? -1 : 1;
    model->updatePivots(columnIn, rowOut, sourceOut);

    baseValue[rowOut] = valueIn;

    // Check for any possible infeasible
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (baseValue[iRow] < baseLower[iRow] - primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        } else if (baseValue[iRow] > baseUpper[iRow] + primalTolerance) {
	  invertHint = invertHint_primalInfeasibleInPrimalSimplex; //Was 1
        }
    }

    // 2. Now we can update the dual
    row_ep.clear();
    row_ap.clear();
    row_ep.count = 1;
    row_ep.index[0] = rowOut;
    row_ep.array[rowOut] = 1;
    row_ep.packFlag = true;
    model->getFactor()->btran(row_ep, row_epDensity);
    model->getMatrix()->price_by_row(row_ap, row_ep);
    row_epDensity = 0.95 * row_epDensity + 0.05 * row_ep.count / numRow;

    double thetaDual = workDual[columnIn] / alpha;
    for (int i = 0; i < row_ap.count; i++) {
        int iCol = row_ap.index[i];
        workDual[iCol] -= thetaDual * row_ap.array[iCol];
    }
    for (int i = 0; i < row_ep.count; i++) {
        int iGet = row_ep.index[i];
        int iCol = iGet + numCol;
        workDual[iCol] -= thetaDual * row_ep.array[iGet];
    }

    // Dual for the pivot
    workDual[columnIn] = 0;
    workDual[columnOut] = -thetaDual;

    // Update model->factor basis
    model->updateFactor(&column, &row_ep, &rowOut, &invertHint);
    model->updateMatrix(columnIn, columnOut);
    if (++countUpdate >= limitUpdate)
      invertHint = invertHint_updateLimitReached; // Was true;

    model->recordPivots(columnIn, columnOut, alpha);
}